

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O0

void __thiscall
MPEGStreamReader::updateFPS
          (MPEGStreamReader *this,void *curNALUnit,uint8_t *buff,uint8_t *nextNal,int oldSPSLen)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  double fps;
  double fps_00;
  double local_50;
  double spsFps;
  int oldSPSLen_local;
  uint8_t *nextNal_local;
  uint8_t *buff_local;
  void *curNALUnit_local;
  MPEGStreamReader *this_local;
  
  (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader
    [0x19])(this,curNALUnit);
  fps_00 = correctFps(fps);
  if ((((fps_00 != 0.0) || (NAN(fps_00))) || (this->m_fps != 0.0)) || (NAN(this->m_fps))) {
    if ((this->m_fps != 0.0) || (NAN(this->m_fps))) {
      if ((fps_00 != 0.0) || (NAN(fps_00))) {
        if (this->m_fps < fps_00) {
          local_50 = fps_00 - this->m_fps;
        }
        else {
          local_50 = this->m_fps - fps_00;
        }
        if (5e-05 < local_50) {
          if ((this->m_isFirstFpsWarn & 1U) != 0) {
            iVar1 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                      _vptr_BaseAbstractStreamReader[0xd])();
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     (string *)(CONCAT44(extraout_var_01,iVar1) + 8));
            poVar2 = std::operator<<(poVar2,
                                     " manual defined fps doesn\'t equal to stream fps. Change ");
            iVar1 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                      _vptr_BaseAbstractStreamReader[0xd])();
            poVar2 = std::operator<<(poVar2,(string *)(CONCAT44(extraout_var_02,iVar1) + 8));
            poVar2 = std::operator<<(poVar2," fps from ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,fps_00);
            poVar2 = std::operator<<(poVar2," to ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_fps);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            sLastMsg = true;
            this->m_isFirstFpsWarn = false;
          }
          (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x1a])
                    (this,curNALUnit,buff,nextNal,(ulong)(uint)oldSPSLen);
          goto LAB_00317489;
        }
      }
      if (((fps_00 == 0.0) && (!NAN(fps_00))) && ((this->m_isFirstFpsWarn & 1U) != 0)) {
        iVar1 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                  _vptr_BaseAbstractStreamReader[0xd])();
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 (string *)(CONCAT44(extraout_var_03,iVar1) + 8));
        poVar2 = std::operator<<(poVar2," stream doesn\'t contain fps field. Muxing fps=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_fps);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
        this->m_isFirstFpsWarn = false;
      }
    }
    else {
      setFPS(this,fps_00);
      iVar1 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0xd])();
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)(CONCAT44(extraout_var_00,iVar1) + 8)
                              );
      poVar2 = std::operator<<(poVar2," muxing fps is not set. Get fps from stream. Value: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,fps_00);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
    }
  }
  else {
    setFPS(this,25.0);
    poVar2 = std::operator<<((ostream *)&std::cout,"This ");
    iVar1 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
              _vptr_BaseAbstractStreamReader[0xd])();
    poVar2 = std::operator<<(poVar2,(string *)(CONCAT44(extraout_var,iVar1) + 8));
    poVar2 = std::operator<<(poVar2,
                             " stream doesn\'t contain fps value. Muxing fps is absent too. Set muxing FPS to default 25.0 value."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    sLastMsg = true;
  }
LAB_00317489:
  (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader
    [0x1b])(this,curNALUnit,buff,nextNal,(ulong)(uint)oldSPSLen);
  return;
}

Assistant:

void MPEGStreamReader::updateFPS(void* curNALUnit, uint8_t* buff, uint8_t* nextNal, const int oldSPSLen)
{
    double spsFps = getStreamFPS(curNALUnit);
    spsFps = correctFps(spsFps);
    if (spsFps == 0.0 && m_fps == 0.0)
    {
        setFPS(25.0);
        LTRACE(LT_INFO, 2,
               "This " << getCodecInfo().displayName
                       << " stream doesn't contain fps value. Muxing fps is absent too. Set muxing FPS to default 25.0 "
                          "value.");
    }
    else if (m_fps == 0.0)
    {
        setFPS(spsFps);
        LTRACE(LT_INFO, 2,
               getCodecInfo().displayName << " muxing fps is not set. Get fps from stream. Value: " << spsFps);
    }
    else if (spsFps != 0.0 && abs_(m_fps, spsFps) > EPSILON)
    {
        if (m_isFirstFpsWarn)
        {
            LTRACE(LT_INFO, 2,
                   getCodecInfo().displayName << " manual defined fps doesn't equal to stream fps. Change "
                                              << getCodecInfo().displayName << " fps from " << spsFps << " to "
                                              << m_fps);
            m_isFirstFpsWarn = false;
        }
        updateStreamFps(curNALUnit, buff, nextNal, oldSPSLen);
    }
    else if (spsFps == 0.0)
    {
        if (m_isFirstFpsWarn)
        {
            LTRACE(LT_INFO, 2, getCodecInfo().displayName << " stream doesn't contain fps field. Muxing fps=" << m_fps);
            m_isFirstFpsWarn = false;
        }
    }
    updateStreamAR(curNALUnit, buff, nextNal, oldSPSLen);
}